

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall
pugi::impl::anon_unknown_0::xml_parser::parse_exclamation
          (xml_parser *this,char_t *s,xml_node_struct *cursor,uint optmsk,char_t endch)

{
  char *pcVar1;
  xml_node_struct *pxVar2;
  int iVar3;
  bool bVar4;
  bool local_4c;
  bool local_48;
  bool local_44;
  byte *local_38;
  char_t *mark;
  char_t endch_local;
  xml_node_struct *pxStack_28;
  uint optmsk_local;
  xml_node_struct *cursor_local;
  char_t *s_local;
  xml_parser *this_local;
  
  pcVar1 = s + 1;
  if (*pcVar1 == '-') {
    if (s[2] != '-') {
      this->error_offset = s + 2;
      this->error_status = status_bad_comment;
      return (char_t *)0x0;
    }
    cursor_local = (xml_node_struct *)(s + 3);
    pxStack_28 = cursor;
    if ((optmsk & 2) != 0) {
      pxStack_28 = append_new_node(cursor,this->alloc,node_comment);
      if (pxStack_28 == (xml_node_struct *)0x0) {
        this->error_offset = (char_t *)cursor_local;
        this->error_status = status_out_of_memory;
        return (char_t *)0x0;
      }
      pxStack_28->value = (char_t *)cursor_local;
    }
    if (((optmsk & 0x20) == 0) || ((optmsk & 2) == 0)) {
      while( true ) {
        local_44 = false;
        if ((char)cursor_local->header != '\0') {
          local_44 = false;
          if ((((char)cursor_local->header == '-') &&
              (local_44 = false, *(char *)((long)&cursor_local->header + 1) == '-')) &&
             (local_44 = true, *(char *)((long)&cursor_local->header + 2) != '>')) {
            local_44 = *(char *)((long)&cursor_local->header + 2) == '\0' && endch == '>';
          }
          local_44 = (bool)(local_44 ^ 1);
        }
        if (!local_44) break;
        cursor_local = (xml_node_struct *)((long)&cursor_local->header + 1);
      }
      if ((char)cursor_local->header == '\0') {
        this->error_offset = (char_t *)cursor_local;
        this->error_status = status_bad_comment;
        return (char_t *)0x0;
      }
      if ((optmsk & 2) != 0) {
        *(undefined1 *)&cursor_local->header = 0;
      }
      iVar3 = 2;
      if (*(char *)((long)&cursor_local->header + 2) == '>') {
        iVar3 = 3;
      }
      cursor_local = (xml_node_struct *)((long)&cursor_local->header + (long)iVar3);
    }
    else {
      cursor_local = (xml_node_struct *)strconv_comment((char_t *)cursor_local,endch);
      if (cursor_local == (xml_node_struct *)0x0) {
        this->error_offset = pxStack_28->value;
        this->error_status = status_bad_comment;
        return (char_t *)0x0;
      }
    }
  }
  else if (*pcVar1 == '[') {
    cursor_local = (xml_node_struct *)(s + 2);
    if ((((s[2] != 'C') || (cursor_local = (xml_node_struct *)(s + 3), s[3] != 'D')) ||
        (cursor_local = (xml_node_struct *)(s + 4), s[4] != 'A')) ||
       (((cursor_local = (xml_node_struct *)(s + 5), s[5] != 'T' ||
         (cursor_local = (xml_node_struct *)(s + 6), s[6] != 'A')) ||
        (cursor_local = (xml_node_struct *)(s + 7), s[7] != '[')))) {
      this->error_offset = (char_t *)cursor_local;
      this->error_status = status_bad_cdata;
      return (char_t *)0x0;
    }
    cursor_local = (xml_node_struct *)(s + 8);
    if ((optmsk & 4) == 0) {
      while( true ) {
        local_4c = false;
        if ((char)cursor_local->header != '\0') {
          local_4c = false;
          if ((((char)cursor_local->header == ']') &&
              (local_4c = false, *(char *)((long)&cursor_local->header + 1) == ']')) &&
             (local_4c = true, *(char *)((long)&cursor_local->header + 2) != '>')) {
            local_4c = *(char *)((long)&cursor_local->header + 2) == '\0' && endch == '>';
          }
          local_4c = (bool)(local_4c ^ 1);
        }
        if (!local_4c) break;
        cursor_local = (xml_node_struct *)((long)&cursor_local->header + 1);
      }
      if ((char)cursor_local->header == '\0') {
        this->error_offset = (char_t *)cursor_local;
        this->error_status = status_bad_cdata;
        return (char_t *)0x0;
      }
      cursor_local = (xml_node_struct *)((long)&cursor_local->header + 1);
    }
    else {
      pxVar2 = append_new_node(cursor,this->alloc,node_cdata);
      if (pxVar2 == (xml_node_struct *)0x0) {
        this->error_offset = (char_t *)cursor_local;
        this->error_status = status_out_of_memory;
        return (char_t *)0x0;
      }
      pxVar2->value = (char_t *)cursor_local;
      if ((optmsk & 0x20) == 0) {
        while( true ) {
          local_48 = false;
          if ((char)cursor_local->header != '\0') {
            local_48 = false;
            if ((((char)cursor_local->header == ']') &&
                (local_48 = false, *(char *)((long)&cursor_local->header + 1) == ']')) &&
               (local_48 = true, *(char *)((long)&cursor_local->header + 2) != '>')) {
              local_48 = *(char *)((long)&cursor_local->header + 2) == '\0' && endch == '>';
            }
            local_48 = (bool)(local_48 ^ 1);
          }
          if (!local_48) break;
          cursor_local = (xml_node_struct *)((long)&cursor_local->header + 1);
        }
        if ((char)cursor_local->header == '\0') {
          this->error_offset = (char_t *)cursor_local;
          this->error_status = status_bad_cdata;
          return (char_t *)0x0;
        }
        *(undefined1 *)&cursor_local->header = 0;
        cursor_local = (xml_node_struct *)((long)&cursor_local->header + 1);
      }
      else {
        cursor_local = (xml_node_struct *)strconv_cdata((char_t *)cursor_local,endch);
        if (cursor_local == (xml_node_struct *)0x0) {
          this->error_offset = pxVar2->value;
          this->error_status = status_bad_cdata;
          return (char_t *)0x0;
        }
      }
    }
    iVar3 = 1;
    if (*(char *)((long)&cursor_local->header + 1) == '>') {
      iVar3 = 2;
    }
    cursor_local = (xml_node_struct *)((long)&cursor_local->header + (long)iVar3);
  }
  else {
    if ((((((*pcVar1 != 'D') || (s[2] != 'O')) || (s[3] != 'C')) || ((s[4] != 'T' || (s[5] != 'Y')))
         ) || (s[6] != 'P')) || ((s[7] != 'E' && ((s[7] != '\0' || (endch != 'E')))))) {
      if ((*pcVar1 == '\0') && (endch == '-')) {
        this->error_offset = pcVar1;
        this->error_status = status_bad_comment;
        return (char_t *)0x0;
      }
      if ((*pcVar1 == '\0') && (endch == '[')) {
        this->error_offset = pcVar1;
        this->error_status = status_bad_cdata;
        return (char_t *)0x0;
      }
      this->error_offset = pcVar1;
      this->error_status = status_unrecognized_tag;
      return (char_t *)0x0;
    }
    if (cursor->parent != (xml_node_struct *)0x0) {
      this->error_offset = s + -1;
      this->error_status = status_bad_doctype;
      return (char_t *)0x0;
    }
    local_38 = (byte *)(s + 8);
    pxVar2 = (xml_node_struct *)parse_doctype_group(this,s + -1,endch);
    if (pxVar2 == (xml_node_struct *)0x0) {
      return (char_t *)0x0;
    }
    if (((char)pxVar2->header != '\0') || (bVar4 = true, endch != '>')) {
      bVar4 = (char)pxVar2->header == '>';
    }
    if (!bVar4) {
      __assert_fail("(*s == 0 && endch == \'>\') || *s == \'>\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                    ,0xc4a,
                    "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_exclamation(char_t *, xml_node_struct *, unsigned int, char_t)"
                   );
    }
    cursor_local = pxVar2;
    if ((char)pxVar2->header != '\0') {
      cursor_local = (xml_node_struct *)((long)&pxVar2->header + 1);
      *(char_t *)&pxVar2->header = '\0';
    }
    if ((optmsk & 0x200) != 0) {
      while (((anonymous_namespace)::chartype_table[*local_38] & 8) != 0) {
        local_38 = local_38 + 1;
      }
      pxVar2 = append_new_node(cursor,this->alloc,node_doctype);
      if (pxVar2 == (xml_node_struct *)0x0) {
        this->error_offset = (char_t *)cursor_local;
        this->error_status = status_out_of_memory;
        return (char_t *)0x0;
      }
      pxVar2->value = (char_t *)local_38;
    }
  }
  return (char_t *)cursor_local;
}

Assistant:

char_t* parse_exclamation(char_t* s, xml_node_struct* cursor, unsigned int optmsk, char_t endch)
		{
			// parse node contents, starting with exclamation mark
			++s;

			if (*s == '-') // '<!-...'
			{
				++s;

				if (*s == '-') // '<!--...'
				{
					++s;

					if (PUGI__OPTSET(parse_comments))
					{
						PUGI__PUSHNODE(node_comment); // Append a new node on the tree.
						cursor->value = s; // Save the offset.
					}

					if (PUGI__OPTSET(parse_eol) && PUGI__OPTSET(parse_comments))
					{
						s = strconv_comment(s, endch);

						if (!s) PUGI__THROW_ERROR(status_bad_comment, cursor->value);
					}
					else
					{
						// Scan for terminating '-->'.
						PUGI__SCANFOR(s[0] == '-' && s[1] == '-' && PUGI__ENDSWITH(s[2], '>'));
						PUGI__CHECK_ERROR(status_bad_comment, s);

						if (PUGI__OPTSET(parse_comments))
							*s = 0; // Zero-terminate this segment at the first terminating '-'.

						s += (s[2] == '>' ? 3 : 2); // Step over the '\0->'.
					}
				}
				else PUGI__THROW_ERROR(status_bad_comment, s);
			}
			else if (*s == '[')
			{
				// '<![CDATA[...'
				if (*++s=='C' && *++s=='D' && *++s=='A' && *++s=='T' && *++s=='A' && *++s == '[')
				{
					++s;

					if (PUGI__OPTSET(parse_cdata))
					{
						PUGI__PUSHNODE(node_cdata); // Append a new node on the tree.
						cursor->value = s; // Save the offset.

						if (PUGI__OPTSET(parse_eol))
						{
							s = strconv_cdata(s, endch);

							if (!s) PUGI__THROW_ERROR(status_bad_cdata, cursor->value);
						}
						else
						{
							// Scan for terminating ']]>'.
							PUGI__SCANFOR(s[0] == ']' && s[1] == ']' && PUGI__ENDSWITH(s[2], '>'));
							PUGI__CHECK_ERROR(status_bad_cdata, s);

							*s++ = 0; // Zero-terminate this segment.
						}
					}
					else // Flagged for discard, but we still have to scan for the terminator.
					{
						// Scan for terminating ']]>'.
						PUGI__SCANFOR(s[0] == ']' && s[1] == ']' && PUGI__ENDSWITH(s[2], '>'));
						PUGI__CHECK_ERROR(status_bad_cdata, s);

						++s;
					}

					s += (s[1] == '>' ? 2 : 1); // Step over the last ']>'.
				}
				else PUGI__THROW_ERROR(status_bad_cdata, s);
			}
			else if (s[0] == 'D' && s[1] == 'O' && s[2] == 'C' && s[3] == 'T' && s[4] == 'Y' && s[5] == 'P' && PUGI__ENDSWITH(s[6], 'E'))
			{
				s -= 2;

				if (cursor->parent) PUGI__THROW_ERROR(status_bad_doctype, s);

				char_t* mark = s + 9;

				s = parse_doctype_group(s, endch);
				if (!s) return s;

				assert((*s == 0 && endch == '>') || *s == '>');
				if (*s) *s++ = 0;

				if (PUGI__OPTSET(parse_doctype))
				{
					while (PUGI__IS_CHARTYPE(*mark, ct_space)) ++mark;

					PUGI__PUSHNODE(node_doctype);

					cursor->value = mark;
				}
			}
			else if (*s == 0 && endch == '-') PUGI__THROW_ERROR(status_bad_comment, s);
			else if (*s == 0 && endch == '[') PUGI__THROW_ERROR(status_bad_cdata, s);
			else PUGI__THROW_ERROR(status_unrecognized_tag, s);

			return s;
		}